

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

adt_bytes_t * dtl_sv_get_bytes(dtl_sv_t *self)

{
  dtl_sv_type_id dVar1;
  adt_bytes_t *paStack_18;
  dtl_sv_type_id currentType;
  adt_bytes_t *retval;
  dtl_sv_t *self_local;
  
  paStack_18 = (adt_bytes_t *)0x0;
  if ((self != (dtl_sv_t *)0x0) && (dVar1 = dtl_sv_type(self), dVar1 == DTL_SV_BYTES)) {
    paStack_18 = (adt_bytes_t *)(self->pAny->val).i64;
  }
  return paStack_18;
}

Assistant:

const adt_bytes_t* dtl_sv_get_bytes(const dtl_sv_t* self)
{
   const adt_bytes_t *retval = (const adt_bytes_t*) 0;
   if (self != 0)
   {
      dtl_sv_type_id currentType = dtl_sv_type(self);
      if (currentType == DTL_SV_BYTES)
      {
         retval = self->pAny->val.bytes;
      }
   }
   return retval;
}